

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-sve.c
# Opt level: O1

void do_fp_imm(DisasContext_conflict1 *s,arg_rpri_esz *a,uint64_t imm,gen_helper_sve_fp2scalar *fn)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  TCGContext_conflict1 *tcg_ctx;
  TCGContext_conflict1 *s_00;
  uint32_t uVar5;
  TCGv_i64 pTVar6;
  TCGTemp *ts;
  TCGTemp *ts_00;
  TCGTemp *ts_01;
  TCGv_ptr pTVar7;
  TCGv_i32 pTVar8;
  uintptr_t o_1;
  uintptr_t o_2;
  uintptr_t o;
  
  tcg_ctx = s->uc->tcg_ctx;
  pTVar6 = tcg_const_i64_aarch64(tcg_ctx,imm);
  iVar1 = a->rd;
  iVar2 = a->rn;
  iVar3 = a->pg;
  iVar4 = a->esz;
  s_00 = s->uc->tcg_ctx;
  uVar5 = s->sve_len;
  ts = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I64,false);
  ts_00 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I64,false);
  ts_01 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I64,false);
  tcg_gen_addi_i64_aarch64
            (s_00,(TCGv_i64)((long)ts - (long)s_00),(TCGv_i64)s_00->cpu_env,
             (long)(iVar1 * 0x100 + 0xc10));
  tcg_gen_addi_i64_aarch64
            (s_00,(TCGv_i64)((long)ts_00 - (long)s_00),(TCGv_i64)s_00->cpu_env,
             (long)(iVar2 * 0x100 + 0xc10));
  tcg_gen_addi_i64_aarch64
            (s_00,(TCGv_i64)((long)ts_01 - (long)s_00),(TCGv_i64)s_00->cpu_env,
             (long)(iVar3 * 0x20 + 0x2c10));
  pTVar7 = get_fpstatus_ptr_aarch64(s_00,iVar4 == 1);
  uVar5 = simd_desc_aarch64(uVar5,uVar5,0);
  pTVar8 = tcg_const_i32_aarch64(s_00,uVar5);
  (*fn)(s_00,(TCGv_ptr)((long)ts - (long)s_00),(TCGv_ptr)((long)ts_00 - (long)s_00),
        (TCGv_ptr)((long)ts_01 - (long)s_00),pTVar6,pTVar7,pTVar8);
  tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(pTVar8 + (long)s_00));
  tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(pTVar7 + (long)s_00));
  tcg_temp_free_internal_aarch64(s_00,ts_01);
  tcg_temp_free_internal_aarch64(s_00,ts_00);
  tcg_temp_free_internal_aarch64(s_00,ts);
  tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(pTVar6 + (long)tcg_ctx));
  return;
}

Assistant:

static void do_fp_imm(DisasContext *s, arg_rpri_esz *a, uint64_t imm,
                      gen_helper_sve_fp2scalar *fn)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i64 temp = tcg_const_i64(tcg_ctx, imm);
    do_fp_scalar(s, a->rd, a->rn, a->pg, a->esz == MO_16, temp, fn);
    tcg_temp_free_i64(tcg_ctx, temp);
}